

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O3

void __thiscall
HighsSearch::branchDownwards(HighsSearch *this,HighsInt col,double newub,double branchpoint)

{
  pointer pNVar1;
  pointer pHVar2;
  bool bVar3;
  shared_ptr<const_StabilizerOrbits> local_58;
  pointer local_40;
  vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>> *local_38;
  
  local_38 = (vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>> *)&this->nodestack
  ;
  pNVar1 = (this->nodestack).
           super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pNVar1[-1].opensubtrees = '\x01';
  pNVar1[-1].branching_point = branchpoint;
  pNVar1[-1].branchingdecision.column = col;
  pNVar1[-1].branchingdecision.boundval = newub;
  pNVar1[-1].branchingdecision.boundtype = kUpper;
  local_40 = (this->localdom).domchgstack_.
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
  pHVar2 = (this->localdom).domchgstack_.
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = orbitsValidInChildNode(this,&pNVar1[-1].branchingdecision);
  HighsDomain::changeBound(&this->localdom,pNVar1[-1].branchingdecision,(Reason)0xffffffff);
  if (bVar3) {
    local_58.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pNVar1[-1].stabilizerOrbits.
         super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = pNVar1[-1].stabilizerOrbits.
            super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_58.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_58.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_58.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
  }
  else {
    local_58.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>>::
  emplace_back<double&,double&,std::shared_ptr<HighsBasis_const>&,std::shared_ptr<StabilizerOrbits_const>>
            (local_38,&pNVar1[-1].lower_bound,&pNVar1[-1].estimate,&pNVar1[-1].nodeBasis,&local_58);
  if (local_58.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->nodestack).
  super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].domgchgStackPos =
       (HighsInt)((ulong)((long)pHVar2 - (long)local_40) >> 4);
  return;
}

Assistant:

void HighsSearch::branchDownwards(HighsInt col, double newub,
                                  double branchpoint) {
  NodeData& currnode = nodestack.back();

  assert(currnode.opensubtrees == 2);
  assert(mipsolver.variableType(col) != HighsVarType::kContinuous);

  currnode.opensubtrees = 1;
  currnode.branching_point = branchpoint;
  currnode.branchingdecision.column = col;
  currnode.branchingdecision.boundval = newub;
  currnode.branchingdecision.boundtype = HighsBoundType::kUpper;

  HighsInt domchgPos = localdom.getDomainChangeStack().size();
  bool passStabilizerToChildNode =
      orbitsValidInChildNode(currnode.branchingdecision);
  localdom.changeBound(currnode.branchingdecision);
  nodestack.emplace_back(
      currnode.lower_bound, currnode.estimate, currnode.nodeBasis,
      passStabilizerToChildNode ? currnode.stabilizerOrbits : nullptr);
  nodestack.back().domgchgStackPos = domchgPos;
}